

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
* __thiscall
QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
::try_emplace<>(pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
                *__return_storage_ptr__,
               QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
               *this,int *key)

{
  containers *pcVar1;
  iterator piVar2;
  bool bVar3;
  long lVar4;
  iterator iVar5;
  
  iVar5 = lower_bound(this,key);
  lVar4 = iVar5.i;
  pcVar1 = iVar5.c;
  if (((pcVar1 == &this->c) && (lVar4 == (this->c).keys.super_QVLABase<int>.super_QVLABaseBase.s))
     || (*key < *(int *)((long)(((containers *)&pcVar1->keys)->keys).super_QVLABase<int>.
                               super_QVLABaseBase.ptr + lVar4 * 4))) {
    QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>::emplace<>
              (&(this->c).values,
               (const_iterator)
               (lVar4 * 0x58 +
               (long)(this->c).values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
                     super_QVLABaseBase.ptr));
    piVar2 = QVarLengthArray<int,_20LL>::insert
                       ((QVarLengthArray<int,_20LL> *)this,
                        (const_iterator)
                        (lVar4 * 4 + (long)(this->c).keys.super_QVLABase<int>.super_QVLABaseBase.ptr
                        ),key);
    lVar4 = (long)piVar2 - (long)(this->c).keys.super_QVLABase<int>.super_QVLABaseBase.ptr >> 2;
    bVar3 = true;
    pcVar1 = &this->c;
  }
  else {
    bVar3 = false;
  }
  (__return_storage_ptr__->first).c = pcVar1;
  (__return_storage_ptr__->first).i = lVar4;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }